

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O3

void __thiscall
OpenMD::GCNSeq::GCNSeq
          (GCNSeq *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType rCut,
          int bins)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  string paramString;
  stringstream params;
  string local_1d8;
  RealType local_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  ios_base local_130 [264];
  
  local_1b8 = rCut;
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer = (_func_int **)&PTR__GCNSeq_0024da90;
  this->rCut_ = local_1b8;
  this->bins_ = bins;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0 = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,"Generalized Coordination Number Distribution","");
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).sequenceType_);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  getPrefix(&local_1d8,filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_1a0 = *plVar3;
    lStack_198 = plVar1[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar3;
    local_1b0 = (long *)*plVar1;
  }
  local_1a8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  this->nnMax_ = 0xc;
  this->delta_ = 18.0 / (double)this->bins_;
  this->usePBC_ =
       (bool)(info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," rcut = ",8);
  poVar2 = std::ostream::_M_insert<double>(this->rCut_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", nbins = ",10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->bins_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", max neighbors = ",0x12);
  std::ostream::operator<<((ostream *)poVar2,this->nnMax_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

GCNSeq::GCNSeq(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 RealType rCut, int bins) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      rCut_(rCut), bins_(bins) {
    setSequenceType("Generalized Coordination Number Distribution");
    setOutputName(getPrefix(filename) + ".gcnSeq");

    nnMax_           = 12;
    RealType binMax_ = nnMax_ * 1.5;
    delta_           = binMax_ / bins_;
    usePBC_          = info->getSimParams()->getUsePeriodicBoundaryConditions();

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << bins_
           << ", max neighbors = " << nnMax_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }